

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenuPrivate::setOverrideMenuAction(QMenuPrivate *this,QAction *a)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  QObject::disconnect((QObject *)this->menuAction,"2destroyed()",pQVar1,
                      "1_q_overrideMenuActionDestroyed()");
  if (a == (QAction *)0x0) {
    this->menuAction = this->defaultMenuAction;
  }
  else {
    this->menuAction = a;
    QObject::connect((QObject *)&CStack_28,(char *)a,(QObject *)"2destroyed()",(char *)pQVar1,
                     0x6db7b7);
    QMetaObject::Connection::~Connection(&CStack_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::setOverrideMenuAction(QAction *a)
{
    Q_Q(QMenu);
    QObject::disconnect(menuAction, SIGNAL(destroyed()), q, SLOT(_q_overrideMenuActionDestroyed()));
    if (a) {
        menuAction = a;
        QObject::connect(a, SIGNAL(destroyed()), q, SLOT(_q_overrideMenuActionDestroyed()));
    } else { //we revert back to the default action created by the QMenu itself
        menuAction = defaultMenuAction;
    }
}